

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitted_normal_matrix.cc
# Opt level: O2

void __thiscall
ipx::SplittedNormalMatrix::Prepare(SplittedNormalMatrix *this,Basis *basis,double *colscale)

{
  vector<int,_std::allocator<int>_> *perm;
  uint uVar1;
  int iVar2;
  Int j;
  pointer piVar3;
  BasicStatus BVar4;
  ulong uVar5;
  size_t k;
  ulong uVar6;
  SparseMatrix *pSVar7;
  vector<int,_std::allocator<int>_> nonbasic_vars;
  _Vector_base<int,_std::allocator<int>_> local_e8;
  vector<int,_std::allocator<int>_> *local_d0;
  SparseMatrix *local_c8;
  Model *local_c0;
  SparseMatrix *local_b8;
  SparseMatrix local_b0;
  
  local_c0 = this->model_;
  uVar1 = local_c0->num_rows_;
  iVar2 = local_c0->num_cols_;
  this->prepared_ = false;
  local_c8 = &this->N_;
  SparseMatrix::clear(local_c8);
  local_b8 = &this->U_;
  perm = &this->rowperm_inv_;
  Basis::GetLuFactors(basis,&this->L_,local_b8,
                      (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->colperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  InversePerm((vector<int,_std::allocator<int>_> *)&local_b0,perm);
  local_d0 = perm;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(perm);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    j = (basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(this->colperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5]];
    BVar4 = Basis::StatusOf(basis,j);
    if (BVar4 == BASIC) {
      ScaleColumn(local_b8,(Int)uVar5,colscale[j]);
    }
  }
  pSVar7 = &local_c0->AI_;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (local_b0.nrow_ = 0; local_b0.nrow_ < (int)(iVar2 + uVar1);
      local_b0.nrow_ = local_b0.nrow_ + 1) {
    BVar4 = Basis::StatusOf(basis,local_b0.nrow_);
    if (BVar4 == NONBASIC) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_e8,&local_b0.nrow_);
    }
  }
  CopyColumns(&local_b0,pSVar7,(vector<int,_std::allocator<int>_> *)&local_e8);
  pSVar7 = local_c8;
  SparseMatrix::operator=(local_c8,&local_b0);
  SparseMatrix::~SparseMatrix(&local_b0);
  PermuteRows(pSVar7,local_d0);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)local_e8._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_e8._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar5 = uVar5 + 1) {
    ScaleColumn(pSVar7,(Int)uVar5,colscale[local_e8._M_impl.super__Vector_impl_data._M_start[uVar5]]
               );
  }
  piVar3 = (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  for (local_b0.nrow_ = 0; local_b0.nrow_ < (int)uVar1; local_b0.nrow_ = local_b0.nrow_ + 1) {
    BVar4 = Basis::StatusOf(basis,(basis->basis_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(this->colperm_).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[local_b0.nrow_]]);
    if (BVar4 == BASIC_FREE) {
      std::vector<int,_std::allocator<int>_>::push_back(&this->free_positions_,&local_b0.nrow_);
    }
  }
  this->prepared_ = true;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_e8);
  return;
}

Assistant:

void SplittedNormalMatrix::Prepare(const Basis& basis, const double* colscale) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    assert(colscale);
    prepared_ = false;
    N_.clear();                 // deallocate old memory

    basis.GetLuFactors(&L_, &U_, rowperm_inv_.data(), colperm_.data());
    rowperm_inv_ = InversePerm(rowperm_inv_);

    // Scale columns of U.
    for (Int k = 0; k < m; k++) {
        Int p = colperm_[k];
        Int j = basis[p];
        // Nothing to do for BASIC_FREE variables.
        if (basis.StatusOf(j) == Basis::BASIC) {
            double d = colscale[j];
            assert(std::isfinite(d) && d > 0.0);
            ScaleColumn(U_, k, d);
        }
    }

    // Build N with permuted row indices.
    std::vector<Int> nonbasic_vars;
    for (Int j = 0; j < n+m; j++)
        if (basis.StatusOf(j) == Basis::NONBASIC)
            nonbasic_vars.push_back(j);
    N_ = CopyColumns(AI, nonbasic_vars);
    PermuteRows(N_, rowperm_inv_);

    // Scale columns of N.
    for (size_t k = 0; k < nonbasic_vars.size(); k++) {
        Int j = nonbasic_vars[k];
        double d = colscale[j];
        assert(std::isfinite(d));
        ScaleColumn(N_, (Int)k, d);
    }

    // Build list of free variables.
    free_positions_.clear();
    for (Int k = 0; k < m; k++) {
        Int p = colperm_[k];
        Int j = basis[p];
        if (basis.StatusOf(j) == Basis::BASIC_FREE)
            free_positions_.push_back(k);
    }
    prepared_ = true;
}